

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  Tag *pTVar7;
  bool bVar8;
  long lVar9;
  
  iVar1 = this->tags_size_;
  bVar8 = true;
  if (iVar1 <= this->tags_count_) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    lVar5 = (long)iVar6 * 0x10;
    uVar3 = 0xffffffffffffffff;
    if (-1 < iVar6) {
      uVar3 = lVar5 + 8;
    }
    plVar2 = (long *)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    if (plVar2 == (long *)0x0) {
      bVar8 = false;
    }
    else {
      *plVar2 = (long)iVar6;
      lVar9 = 0;
      pTVar7 = (Tag *)(plVar2 + 1);
      do {
        Tag::Tag(pTVar7);
        lVar9 = lVar9 + -0x10;
        pTVar7 = pTVar7 + 1;
      } while (-lVar9 != lVar5);
      pTVar7 = this->tags_;
      uVar4 = 0;
      uVar3 = (ulong)(uint)this->tags_count_;
      if (this->tags_count_ < 1) {
        uVar3 = uVar4;
      }
      bVar8 = true;
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        *(undefined8 *)((long)plVar2 + uVar4 + 8) =
             *(undefined8 *)((long)&pTVar7->simple_tags_ + uVar4);
        *(undefined8 *)((long)plVar2 + uVar4 + 0x10) =
             *(undefined8 *)((long)&pTVar7->simple_tags_size_ + uVar4);
      }
      if (pTVar7 != (Tag *)0x0) {
        lVar5._0_4_ = pTVar7[-1].simple_tags_size_;
        lVar5._4_4_ = pTVar7[-1].simple_tags_count_;
        if (lVar5 != 0) {
          lVar5 = lVar5 << 4;
          do {
            Tag::~Tag((Tag *)((long)&pTVar7[-1].simple_tags_ + lVar5));
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
        }
        operator_delete__(&pTVar7[-1].simple_tags_size_);
      }
      this->tags_ = (Tag *)(plVar2 + 1);
      this->tags_size_ = iVar6;
    }
  }
  return bVar8;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}